

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_compResetPolicy_e crp,ZSTD_indexResetPolicy_e forceResetIndex,
                 ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  ZSTD_cwksp_alloc_phase_e ZVar2;
  uint *puVar3;
  undefined1 *puVar4;
  undefined1 auVar5 [16];
  ZSTD_strategy ZVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  size_t sVar12;
  void *pvVar13;
  uint *puVar14;
  ZSTD_match_t *pZVar15;
  void *pvVar16;
  void *pvVar17;
  uint *puVar18;
  ZSTD_match_t *pZVar19;
  U32 *pUVar20;
  uint uVar21;
  void *alloc;
  U32 *pUVar22;
  void *alloc_1;
  long lVar23;
  U32 *pUVar24;
  
  if (cParams->strategy == ZSTD_fast) {
    lVar23 = 0;
  }
  else {
    lVar23 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  uVar21 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    uVar21 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar21 = cParams->windowLog;
    }
  }
  uVar1 = cParams->hashLog;
  if (forceResetIndex == ZSTDirp_reset) {
    (ms->window).base = "";
    (ms->window).dictBase = "";
    (ms->window).dictLimit = 1;
    (ms->window).lowLimit = 1;
    (ms->window).nextSrc = (BYTE *)"num chunks = %li (bit plane) and %li (exponent) \n";
    if (ws->tableValidEnd < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d55,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if (ws->allocStart < ws->tableValidEnd) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d56,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
  }
  ms->hashLog3 = uVar21;
  auVar5 = vpshufd_avx(ZEXT416((uint)(*(int *)&(ms->window).nextSrc - *(int *)&(ms->window).base)),
                       0x10);
  *(undefined1 (*) [16])&(ms->window).dictLimit = auVar5;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  if (ws->allocFailed != 0) {
    __assert_fail("!ZSTD_cwksp_reserve_failed(ws)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2f8b,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  ws->tableEnd = ws->objectEnd;
  ZSTD_cwksp_assert_internal_consistency(ws);
  ZVar2 = ws->phase;
  if ((int)ZVar2 < 3) {
    pUVar20 = (U32 *)ws->tableEnd;
    pUVar24 = (U32 *)ws->allocStart;
    pUVar22 = (U32 *)((4L << ((byte)uVar1 & 0x3f)) + (long)pUVar20);
    if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
      if ((int)ZVar2 < 1) {
        pvVar13 = ws->objectEnd;
        ws->tableValidEnd = pvVar13;
      }
      else {
        pvVar13 = ws->tableValidEnd;
      }
      pvVar16 = (void *)((ulong)pUVar24 & 0xfffffffffffffffc);
      ws->allocStart = pvVar16;
      if (pvVar16 < pvVar13) {
        ws->tableValidEnd = pvVar16;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pUVar22 <= pUVar24) {
      ws->tableEnd = pUVar22;
      ms->hashTable = pUVar20;
      ZVar2 = ws->phase;
      if (2 < (int)ZVar2) goto LAB_00171b46;
      pUVar24 = (U32 *)(lVar23 + (long)pUVar22);
      pUVar20 = (U32 *)ws->allocStart;
      if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
        if ((int)ZVar2 < 1) {
          pvVar13 = ws->objectEnd;
          ws->tableValidEnd = pvVar13;
        }
        else {
          pvVar13 = ws->tableValidEnd;
        }
        pvVar16 = (void *)((ulong)pUVar20 & 0xfffffffffffffffc);
        ws->allocStart = pvVar16;
        if (pvVar16 < pvVar13) {
          ws->tableValidEnd = pvVar16;
        }
        ws->phase = ZSTD_cwksp_alloc_aligned;
      }
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pUVar24 <= pUVar20) {
        ws->tableEnd = pUVar24;
        ms->chainTable = pUVar22;
        lVar23 = 4L << ((byte)uVar21 & 0x3f);
        if (uVar21 == 0) {
          lVar23 = 0;
        }
        ZVar2 = ws->phase;
        if (2 < (int)ZVar2) goto LAB_00171b46;
        pvVar16 = (void *)(lVar23 + (long)pUVar24);
        pvVar13 = ws->allocStart;
        if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
          if ((int)ZVar2 < 1) {
            pvVar11 = ws->objectEnd;
            ws->tableValidEnd = pvVar11;
          }
          else {
            pvVar11 = ws->tableValidEnd;
          }
          pvVar17 = (void *)((ulong)pvVar13 & 0xfffffffffffffffc);
          ws->allocStart = pvVar17;
          if (pvVar17 < pvVar11) {
            ws->tableValidEnd = pvVar17;
          }
          ws->phase = ZSTD_cwksp_alloc_aligned;
        }
        ZSTD_cwksp_assert_internal_consistency(ws);
        if (pvVar16 <= pvVar13) {
          ws->tableEnd = pvVar16;
          ms->hashTable3 = pUVar24;
          sVar12 = 0xffffffffffffffc0;
          if (ws->allocFailed == 0) {
            if (crp != ZSTDcrp_leaveDirty) {
              pvVar13 = ws->objectEnd;
              pvVar11 = ws->tableValidEnd;
              if (pvVar11 < pvVar13) {
                __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d6a,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
              }
              if (ws->allocStart < pvVar11) {
                __assert_fail("ws->tableValidEnd <= ws->allocStart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d6b,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
              }
              if (pvVar11 < pvVar16) {
                memset(pvVar11,0,(long)pvVar16 - (long)pvVar11);
                pvVar13 = ws->objectEnd;
                pvVar11 = ws->tableValidEnd;
              }
              if (pvVar11 < pvVar13) {
                __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d5d,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
              }
              if (ws->allocStart < pvVar11) {
                __assert_fail("ws->tableValidEnd <= ws->allocStart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1d5e,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
              }
              if (pvVar11 < ws->tableEnd) {
                ws->tableValidEnd = ws->tableEnd;
              }
              ZSTD_cwksp_assert_internal_consistency(ws);
            }
            if ((forWho == ZSTD_resetTarget_CCtx) && (6 < (int)cParams->strategy)) {
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00171b46;
              puVar14 = (uint *)ws->tableEnd;
              if (ZVar2 == ZSTD_cwksp_alloc_aligned) {
                pvVar16 = ws->allocStart;
              }
              else {
                if ((int)ZVar2 < 1) {
                  pvVar13 = ws->objectEnd;
                  ws->tableValidEnd = pvVar13;
                }
                else {
                  pvVar13 = ws->tableValidEnd;
                }
                pvVar16 = (void *)((ulong)ws->allocStart & 0xfffffffffffffffc);
                ws->allocStart = pvVar16;
                if (pvVar16 < pvVar13) {
                  ws->tableValidEnd = pvVar16;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar18 = (uint *)((long)pvVar16 + -0x400);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar18 < puVar14) {
LAB_00171ba3:
                __assert_fail("alloc >= bottom",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1cdd,
                              "void *ZSTD_cwksp_reserve_internal(ZSTD_cwksp *, size_t, ZSTD_cwksp_alloc_phase_e)"
                             );
              }
              puVar14 = (uint *)ws->tableValidEnd;
              if (puVar18 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar18;
                puVar14 = puVar18;
              }
              ws->allocStart = puVar18;
              (ms->opt).litFreq = puVar18;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00171b46;
              puVar3 = (uint *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  puVar14 = (uint *)ws->objectEnd;
                  ws->tableValidEnd = puVar14;
                }
                puVar18 = (uint *)((ulong)puVar18 & 0xfffffffffffffffc);
                ws->allocStart = puVar18;
                if (puVar18 < puVar14) {
                  ws->tableValidEnd = puVar18;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar18 = puVar18 + -0x24;
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar18 < puVar3) goto LAB_00171ba3;
              puVar14 = (uint *)ws->tableValidEnd;
              if (puVar18 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar18;
                puVar14 = puVar18;
              }
              ws->allocStart = puVar18;
              (ms->opt).litLengthFreq = puVar18;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00171b46;
              puVar3 = (uint *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  puVar14 = (uint *)ws->objectEnd;
                  ws->tableValidEnd = puVar14;
                }
                puVar18 = (uint *)((ulong)puVar18 & 0xfffffffffffffffc);
                ws->allocStart = puVar18;
                if (puVar18 < puVar14) {
                  ws->tableValidEnd = puVar18;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar18 = puVar18 + -0x35;
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar18 < puVar3) goto LAB_00171ba3;
              puVar14 = (uint *)ws->tableValidEnd;
              if (puVar18 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar18;
                puVar14 = puVar18;
              }
              ws->allocStart = puVar18;
              (ms->opt).matchLengthFreq = puVar18;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00171b46;
              puVar3 = (uint *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  puVar14 = (uint *)ws->objectEnd;
                  ws->tableValidEnd = puVar14;
                }
                puVar18 = (uint *)((ulong)puVar18 & 0xfffffffffffffffc);
                ws->allocStart = puVar18;
                if (puVar18 < puVar14) {
                  ws->tableValidEnd = puVar18;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              puVar18 = puVar18 + -0x20;
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (puVar18 < puVar3) goto LAB_00171ba3;
              puVar14 = (uint *)ws->tableValidEnd;
              if (puVar18 < ws->tableValidEnd) {
                ws->tableValidEnd = puVar18;
                puVar14 = puVar18;
              }
              ws->allocStart = puVar18;
              (ms->opt).offCodeFreq = puVar18;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00171b46;
              pZVar15 = (ZSTD_match_t *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  puVar14 = (uint *)ws->objectEnd;
                  ws->tableValidEnd = puVar14;
                }
                puVar18 = (uint *)((ulong)puVar18 & 0xfffffffffffffffc);
                ws->allocStart = puVar18;
                if (puVar18 < puVar14) {
                  ws->tableValidEnd = puVar18;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              pZVar19 = (ZSTD_match_t *)(puVar18 + -0x2002);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (pZVar19 < pZVar15) goto LAB_00171ba3;
              pZVar15 = (ZSTD_match_t *)ws->tableValidEnd;
              if (pZVar19 < (ZSTD_match_t *)ws->tableValidEnd) {
                ws->tableValidEnd = pZVar19;
                pZVar15 = pZVar19;
              }
              ws->allocStart = pZVar19;
              (ms->opt).matchTable = pZVar19;
              ZVar2 = ws->phase;
              if (2 < (int)ZVar2) goto LAB_00171b46;
              puVar4 = (undefined1 *)ws->tableEnd;
              if (ZVar2 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar2 < 1) {
                  pZVar15 = (ZSTD_match_t *)ws->objectEnd;
                  ws->tableValidEnd = pZVar15;
                }
                pZVar19 = (ZSTD_match_t *)((ulong)pZVar19 & 0xfffffffffffffffc);
                ws->allocStart = pZVar19;
                if (pZVar19 < pZVar15) {
                  ws->tableValidEnd = pZVar19;
                }
                ws->phase = ZSTD_cwksp_alloc_aligned;
              }
              pUVar20 = &pZVar19[-0x3804].len;
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (pUVar20 < puVar4) goto LAB_00171ba3;
              if (pUVar20 < ws->tableValidEnd) {
                ws->tableValidEnd = pUVar20;
              }
              ws->allocStart = pUVar20;
              (ms->opt).priceTable = (ZSTD_optimal_t *)pUVar20;
            }
            uVar7 = cParams->windowLog;
            uVar8 = cParams->chainLog;
            uVar9 = cParams->hashLog;
            uVar10 = cParams->searchLog;
            uVar21 = cParams->minMatch;
            uVar1 = cParams->targetLength;
            ZVar6 = cParams->strategy;
            (ms->cParams).searchLog = cParams->searchLog;
            (ms->cParams).minMatch = uVar21;
            (ms->cParams).targetLength = uVar1;
            (ms->cParams).strategy = ZVar6;
            (ms->cParams).windowLog = uVar7;
            (ms->cParams).chainLog = uVar8;
            (ms->cParams).hashLog = uVar9;
            (ms->cParams).searchLog = uVar10;
            sVar12 = (ulong)(ws->allocFailed == 0) * 0x40 - 0x40;
          }
          return sVar12;
        }
      }
    }
    __assert_fail("end <= top",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1d11,"void *ZSTD_cwksp_reserve_table(ZSTD_cwksp *, size_t)");
  }
LAB_00171b46:
  __assert_fail("phase >= ws->phase",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x1cac,
                "void ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)");
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    return 0;
}